

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

void __thiscall QHttp2Connection::handleRST_STREAM(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  bool bVar1;
  uint *puVar2;
  QPointer<QHttp2Stream> *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_40;
  quint32 streamID;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  streamID = Http2::Frame::streamID((Frame *)this_00);
  if (streamID == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      connectionError(this,PROTOCOL_ERROR,"RST_STREAM on 0x0");
      return;
    }
  }
  else {
    puVar2 = (uint *)Http2::Frame::dataBegin((Frame *)this_00);
    uVar4 = *puVar2;
    pQVar3 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::operator[]
                       ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)(this + 0x1c0),&streamID);
    local_40.d = (pQVar3->wp).d;
    local_40.value = (pQVar3->wp).value;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_40);
    if (bVar1) {
      QHttp2Stream::rstFrameRecived
                ((QHttp2Stream *)local_40.value,
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_40);
    if (((*(int *)(this + 0x10) == 0 ^ (byte)streamID) & 1) == 0) {
      uVar4 = *(int *)(this + 0x210) - 2;
    }
    else {
      uVar4 = *(uint *)(this + 0x2ac);
    }
    if (uVar4 < streamID) {
      connectionError(this,PROTOCOL_ERROR,"RST_STREAM on idle stream");
    }
    else {
      pQVar3 = QHash<unsigned_int,_QPointer<QHttp2Stream>_>::operator[]
                         ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)(this + 0x1c0),&streamID);
      local_40.d = (pQVar3->wp).d;
      local_40.value = (pQVar3->wp).value;
      if (local_40.d != (Data *)0x0) {
        LOCK();
        ((local_40.d)->weakref)._q_value.super___atomic_base<int>._M_i =
             ((local_40.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_40);
      if (bVar1) {
        QHttp2Stream::handleRST_STREAM((QHttp2Stream *)local_40.value,(Frame *)this_00);
      }
      QWeakPointer<QObject>::~QWeakPointer(&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handleRST_STREAM()
{
    Q_ASSERT(inboundFrame.type() == FrameType::RST_STREAM);

    // RFC 9113, 6.4: RST_STREAM frames MUST be associated with a stream.
    // If a RST_STREAM frame is received with a stream identifier of 0x0,
    // the recipient MUST treat this as a connection error (Section 5.4.1)
    // of type PROTOCOL_ERROR.
    const auto streamID = inboundFrame.streamID();
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on 0x0");

    // RFC 9113, 6.4: A RST_STREAM frame with a length other than 4 octets MUST be treated as a
    // connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 4);

    const auto error = qFromBigEndian<quint32>(inboundFrame.dataBegin());
    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        emit stream->rstFrameRecived(error);

    // Verify that whatever stream is being RST'd is not in the idle state:
    const quint32 lastRelevantStreamID = [this, streamID]() {
        quint32 peerMask = m_connectionType == Type::Client ? 0 : 1;
        return ((streamID & 1) == peerMask) ? m_lastIncomingStreamID : m_nextStreamID - 2;
    }();
    if (streamID > lastRelevantStreamID) {
        // "RST_STREAM frames MUST NOT be sent for a stream
        // in the "idle" state. .. the recipient MUST treat this
        // as a connection error (Section 5.4.1) of type PROTOCOL_ERROR."
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on idle stream");
    }

    Q_ASSERT(inboundFrame.dataSize() == 4);

    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        stream->handleRST_STREAM(inboundFrame);
}